

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.h
# Opt level: O2

void __thiscall CS248::Timeline::Timeline(Timeline *this)

{
  _Rb_tree_header *p_Var1;
  
  this->x = 0;
  this->y = 0;
  this->w = 0x180;
  this->h = 0;
  (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->times)._M_t._M_impl.super__Rb_tree_header;
  (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->times)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->isLooping = false;
  return;
}

Assistant:

Timeline() : x(0), y(0), w(64 * 6), h(0) { isLooping = false; }